

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

void __thiscall
kj::Vector<kj::Promise<void>_>::setCapacity(Vector<kj::Promise<void>_> *this,size_t newSize)

{
  Promise<void> *pPVar1;
  RemoveConst<kj::Promise<void>_> *pRVar2;
  Promise<void> *pPVar3;
  __off_t in_RDX;
  ArrayBuilder<kj::Promise<void>_> newBuilder;
  ArrayBuilder<kj::Promise<void>_> local_38;
  
  if (newSize < (ulong)((long)(this->builder).pos - (long)(this->builder).ptr >> 4)) {
    ArrayBuilder<kj::Promise<void>_>::truncate(&this->builder,(char *)newSize,in_RDX);
  }
  local_38.ptr = (Promise<void> *)
                 kj::_::HeapArrayDisposer::allocateImpl
                           (0x10,0,newSize,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_38.endPtr = local_38.ptr + newSize;
  local_38.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  pPVar1 = (this->builder).pos;
  local_38.pos = local_38.ptr;
  for (pPVar3 = (this->builder).ptr; pPVar3 != pPVar1; pPVar3 = pPVar3 + 1) {
    ((local_38.pos)->super_PromiseBase).node.disposer = (pPVar3->super_PromiseBase).node.disposer;
    ((local_38.pos)->super_PromiseBase).node.ptr = (pPVar3->super_PromiseBase).node.ptr;
    (pPVar3->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
    local_38.pos = local_38.pos + 1;
  }
  ArrayBuilder<kj::Promise<void>_>::operator=(&this->builder,&local_38);
  pPVar1 = local_38.endPtr;
  pRVar2 = local_38.pos;
  pPVar3 = local_38.ptr;
  if (local_38.ptr != (Promise<void> *)0x0) {
    local_38.ptr = (Promise<void> *)0x0;
    local_38.pos = (RemoveConst<kj::Promise<void>_> *)0x0;
    local_38.endPtr = (Promise<void> *)0x0;
    (**(local_38.disposer)->_vptr_ArrayDisposer)
              (local_38.disposer,pPVar3,0x10,(long)pRVar2 - (long)pPVar3 >> 4,
               (long)pPVar1 - (long)pPVar3 >> 4,
               ArrayDisposer::Dispose_<kj::Promise<void>,_false>::destruct);
  }
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }